

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

bool __thiscall GGWave::computeFFTR(GGWave *this,float *src,float *dst,int N)

{
  uint in_ECX;
  float *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_stack_ffffffffffffffa8;
  int N_00;
  undefined4 in_stack_ffffffffffffffc0;
  bool local_1;
  
  N_00 = (int)((ulong)in_RSI >> 0x20);
  if (in_ECX == *(uint *)(in_RDI + 0xc)) {
    ggvector<int>::data((ggvector<int> *)(in_RDI + 0xc0));
    ggvector<float>::data((ggvector<float> *)(in_RDI + 0xd0));
    anon_unknown.dwarf_1d8e::FFT
              ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),in_RDX,N_00,
               in_stack_ffffffffffffffa8,(float *)0x112758);
    local_1 = true;
  }
  else {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,
              "computeFFTR: N (%d) must be equal to \'samplesPerFrame\' %d\n",(ulong)in_ECX,
              (ulong)*(uint *)(in_RDI + 0xc));
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GGWave::computeFFTR(const float * src, float * dst, int N) {
    if (N != m_samplesPerFrame) {
        ggprintf("computeFFTR: N (%d) must be equal to 'samplesPerFrame' %d\n", N, m_samplesPerFrame);
        return false;
    }

    FFT(src, dst, N, m_rx.fftWorkI.data(), m_rx.fftWorkF.data());

    return true;
}